

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::setCursorAbsoluteColumn(PatternModel *this,int absolute)

{
  iterator pvVar1;
  value_type_conflict3 max;
  iterator __end1;
  iterator __begin1;
  array<int,_4UL> *__range1;
  int track;
  int absolute_local;
  PatternModel *this_local;
  
  __range1._0_4_ = -1;
  __end1 = std::array<int,_4UL>::begin(&this->mMaxColumns);
  pvVar1 = std::array<int,_4UL>::end(&this->mMaxColumns);
  __range1._4_4_ = absolute;
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    __range1._0_4_ = (int)__range1 + 1;
    if (__range1._4_4_ < *__end1) break;
    __range1._4_4_ = __range1._4_4_ - *__end1;
  }
  setCursorTrack(this,(int)__range1);
  setCursorColumn(this,__range1._4_4_);
  return;
}

Assistant:

void PatternModel::setCursorAbsoluteColumn(int absolute) {
    // find the track
    int track = -1;
    for (auto max : mMaxColumns) {
        ++track;
        if (absolute < max) {
            break;
        }
        absolute -= max;
    }

    setCursorTrack(track);
    setCursorColumn(absolute);
}